

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

bool dap::writef(shared_ptr<dap::Writer> *w,char *msg,...)

{
  char in_AL;
  undefined1 uVar1;
  element_type *peVar2;
  size_t sVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_8e8 [16];
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined4 local_838;
  undefined4 local_834;
  va_list vararg;
  char local_818 [8];
  char buf [2048];
  char *msg_local;
  shared_ptr<dap::Writer> *w_local;
  
  if (in_AL != '\0') {
    local_8b8 = in_XMM0_Qa;
    local_8a8 = in_XMM1_Qa;
    local_898 = in_XMM2_Qa;
    local_888 = in_XMM3_Qa;
    local_878 = in_XMM4_Qa;
    local_868 = in_XMM5_Qa;
    local_858 = in_XMM6_Qa;
    local_848 = in_XMM7_Qa;
  }
  vararg[0].overflow_arg_area = local_8e8;
  vararg[0]._0_8_ = &stack0x00000008;
  local_834 = 0x30;
  local_838 = 0x10;
  local_8d8 = in_RDX;
  local_8d0 = in_RCX;
  local_8c8 = in_R8;
  local_8c0 = in_R9;
  buf._2040_8_ = msg;
  vsnprintf(local_818,0x800,msg,&local_838);
  peVar2 = std::__shared_ptr_access<dap::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dap::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      w);
  sVar3 = strlen(local_818);
  uVar1 = (**(code **)((long)*peVar2 + 0x20))(peVar2,local_818,sVar3);
  return (bool)uVar1;
}

Assistant:

bool writef(const std::shared_ptr<Writer>& w, const char* msg, ...) {
  char buf[2048];

  va_list vararg;
  va_start(vararg, msg);
  vsnprintf(buf, sizeof(buf), msg, vararg);
  va_end(vararg);

  return w->write(buf, strlen(buf));
}